

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O2

bool __thiscall CppJieba::HMMSegment::_loadModel(HMMSegment *this,char *filePath)

{
  double dVar1;
  pointer pbVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  double (*padVar8) [4];
  allocator local_2b9;
  string local_2b8;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp2;
  ifstream ifile;
  
  std::__cxx11::string::string((string *)&ifile,"loadModel [%s] start ...",(allocator *)&line);
  Limonp::Logger::LoggingF(1,"HMMSegment.hpp",200,(string *)&ifile,filePath);
  std::__cxx11::string::~string((string *)&ifile);
  std::ifstream::ifstream(&ifile,filePath,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  tmp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tmp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmp2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tmp2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = _getLine(this,&ifile,&line);
  if (bVar3) {
    std::__cxx11::string::string((string *)&local_2b8," ",&local_2b9);
    Limonp::splitStr(&line,&tmp,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    pbVar2 = tmp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)tmp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)tmp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x80) {
      for (uVar4 = 0; uVar6 = (ulong)uVar4, uVar6 < 4; uVar4 = uVar4 + 1) {
        dVar1 = atof(pbVar2[uVar6]._M_dataplus._M_p);
        this->_startProb[uVar6] = dVar1;
      }
      padVar8 = this->_transProb;
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        bVar3 = _getLine(this,&ifile,&line);
        if (!bVar3) goto LAB_001152b8;
        std::__cxx11::string::string((string *)&local_2b8," ",&local_2b9);
        Limonp::splitStr(&line,&tmp,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        pbVar2 = tmp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)tmp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)tmp.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x80) {
          std::__cxx11::string::string((string *)&local_2b8,"trans_p illegal",&local_2b9);
          Limonp::Logger::LoggingF(3,"HMMSegment.hpp",0xe8,&local_2b8);
          goto LAB_001152ae;
        }
        for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 8) {
          dVar1 = atof(*(char **)((long)&(pbVar2->_M_dataplus)._M_p + lVar7 * 4));
          *(double *)((long)*padVar8 + lVar7) = dVar1;
        }
        padVar8 = padVar8 + 1;
      }
      bVar3 = _getLine(this,&ifile,&line);
      if (bVar3) {
        bVar3 = _loadEmitProb(this,&line,&this->_emitProbB);
        if (bVar3) {
          bVar3 = _getLine(this,&ifile,&line);
          if (bVar3) {
            bVar3 = _loadEmitProb(this,&line,&this->_emitProbE);
            if (bVar3) {
              bVar3 = _getLine(this,&ifile,&line);
              if (bVar3) {
                bVar3 = _loadEmitProb(this,&line,&this->_emitProbM);
                if (bVar3) {
                  bVar3 = _getLine(this,&ifile,&line);
                  if (bVar3) {
                    bVar3 = _loadEmitProb(this,&line,&this->_emitProbS);
                    if (bVar3) {
                      std::__cxx11::string::string
                                ((string *)&local_2b8,"loadModel [%s] end.",&local_2b9);
                      Limonp::Logger::LoggingF(1,"HMMSegment.hpp",0x10a,&local_2b8,filePath);
                      std::__cxx11::string::~string((string *)&local_2b8);
                      bVar3 = true;
                      goto LAB_001152ba;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_2b8,"start_p illegal",&local_2b9);
      Limonp::Logger::LoggingF(3,"HMMSegment.hpp",0xd5,&local_2b8);
LAB_001152ae:
      std::__cxx11::string::~string((string *)&local_2b8);
    }
  }
LAB_001152b8:
  bVar3 = false;
LAB_001152ba:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tmp2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tmp);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&ifile);
  return bVar3;
}

Assistant:

bool _loadModel(const char* const filePath)
            {
                LogInfo("loadModel [%s] start ...", filePath);
                ifstream ifile(filePath);
                string line;
                vector<string> tmp;
                vector<string> tmp2;
                //load _startProb
                if(!_getLine(ifile, line))
                {
                    return false;
                }
                splitStr(line, tmp, " ");
                if(tmp.size() != STATUS_SUM)
                {
                    LogError("start_p illegal");
                    return false;
                }
                for(uint j = 0; j< tmp.size(); j++)
                {
                    _startProb[j] = atof(tmp[j].c_str());
                    //cout<<_startProb[j]<<endl;
                }

                //load _transProb
                for(uint i = 0; i < STATUS_SUM; i++)
                {
                    if(!_getLine(ifile, line))
                    {
                        return false;
                    }
                    splitStr(line, tmp, " ");
                    if(tmp.size() != STATUS_SUM)
                    {
                        LogError("trans_p illegal");
                        return false;
                    }
                    for(uint j =0; j < STATUS_SUM; j++)
                    {
                        _transProb[i][j] = atof(tmp[j].c_str());
                        //cout<<_transProb[i][j]<<endl;
                    }
                }

                //load _emitProbB
                if(!_getLine(ifile, line) || !_loadEmitProb(line, _emitProbB))
                {
                    return false;
                }

                //load _emitProbE
                if(!_getLine(ifile, line) || !_loadEmitProb(line, _emitProbE))
                {
                    return false;
                }

                //load _emitProbM
                if(!_getLine(ifile, line) || !_loadEmitProb(line, _emitProbM))
                {
                    return false;
                }

                //load _emitProbS
                if(!_getLine(ifile, line) || !_loadEmitProb(line, _emitProbS))
                {
                    return false;
                }

                LogInfo("loadModel [%s] end.", filePath);

                return true;
            }